

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

void __thiscall
mocker::RenameASTDeclarations::renameGlobalVar(RenameASTDeclarations *this,VarDecl *node)

{
  element_type *peVar1;
  pointer pcVar2;
  string oldIdent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  peVar1 = (((node->decl).super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->identifier).
           super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar2 = (peVar1->val)._M_dataplus._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (peVar1->val)._M_string_length);
  std::operator+(&local_38,"@",&local_58);
  std::__cxx11::string::operator=
            ((string *)
             &((((node->decl).
                 super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               identifier).super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->val,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void renameGlobalVar(ast::VarDecl &node) const {
    auto oldIdent = node.decl->identifier->val;
    node.decl->identifier->val = "@" + oldIdent;
  }